

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

void iqnet::ssl::throw_io_exception(SSL *ssl,int ret)

{
  int err;
  uint uVar1;
  connection_close *this;
  io_error *this_00;
  network_error *this_01;
  pointer_____offset_0x10___ *ppuVar2;
  allocator<char> local_39;
  string local_38;
  
  err = SSL_get_error((SSL *)ssl,ret);
  switch(err) {
  case 0:
    return;
  case 1:
    this = (connection_close *)__cxa_allocate_exception(0x30);
    exception::exception((exception *)this);
    ppuVar2 = &exception::typeinfo;
    break;
  case 2:
    this = (connection_close *)__cxa_allocate_exception(0x30);
    need_read::need_read((need_read *)this);
    ppuVar2 = &need_read::typeinfo;
    break;
  case 3:
    this = (connection_close *)__cxa_allocate_exception(0x30);
    need_write::need_write((need_write *)this);
    ppuVar2 = &need_write::typeinfo;
    break;
  default:
    this_00 = (io_error *)__cxa_allocate_exception(0x30);
    io_error::io_error(this_00,err);
    __cxa_throw(this_00,&io_error::typeinfo,exception::~exception);
  case 5:
    if (ret != 0) {
      this_01 = (network_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"iqnet::ssl::throw_io_exception",&local_39);
      network_error::network_error(this_01,&local_38,true,0);
      __cxa_throw(this_01,&network_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this = (connection_close *)__cxa_allocate_exception(0x38);
    connection_close::connection_close(this,false);
    goto LAB_00178677;
  case 6:
    uVar1 = SSL_get_shutdown((SSL *)ssl);
    this = (connection_close *)__cxa_allocate_exception(0x38);
    connection_close::connection_close(this,SUB41((uVar1 & 2) >> 1,0));
LAB_00178677:
    ppuVar2 = &connection_close::typeinfo;
  }
  __cxa_throw(this,ppuVar2,exception::~exception);
}

Assistant:

void throw_io_exception( SSL* ssl, int ret )
{
  int code = SSL_get_error( ssl, ret );
  switch( code )
  {
    case SSL_ERROR_NONE:
      return;

    case SSL_ERROR_ZERO_RETURN:
    {
      bool clean = (SSL_get_shutdown(ssl) & SSL_RECEIVED_SHUTDOWN) != 0;
      throw connection_close( clean );
    }

    case SSL_ERROR_WANT_READ:
      throw need_read();

    case SSL_ERROR_WANT_WRITE:
      throw need_write();

    case SSL_ERROR_SYSCALL:
      if( !ret )
        throw connection_close( false );
      else
        throw iqnet::network_error( "iqnet::ssl::throw_io_exception" );

    case SSL_ERROR_SSL:
      throw exception();

    default:
      throw io_error( code );
  }
}